

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

Error asmjit::v1_14::Formatter::formatData
                (String *sb,FormatFlags formatFlags,Arch arch,TypeId typeId,void *data,
                size_t itemCount,size_t repeatCount)

{
  byte bVar1;
  uint uVar2;
  Error EVar3;
  uint64_t i;
  long lVar4;
  long lVar5;
  uint uVar7;
  bool bVar8;
  ulong uVar6;
  
  if (kMIPS64_BE < arch) {
    return 4;
  }
  bVar1 = TypeUtils::_typeData[(ulong)typeId + 0x100];
  if (bVar1 == 0) {
    EVar3 = 3;
  }
  else {
    uVar2 = (uint)bVar1;
    bVar8 = (uVar2 & bVar1 - 1) == 0;
    uVar7 = 1;
    if (bVar8) {
      uVar7 = uVar2;
    }
    uVar6 = 1;
    if (!bVar8) {
      uVar6 = (ulong)uVar2;
    }
    lVar5 = uVar6 * itemCount;
    if (8 < uVar7) {
      uVar6 = (ulong)uVar2;
      uVar2 = (uint)bVar1;
      do {
        uVar6 = uVar6 >> 1;
        lVar5 = lVar5 * 2;
        uVar7 = (uint)uVar6;
        bVar8 = 0x11 < uVar2;
        uVar2 = uVar7;
      } while (bVar8);
    }
    uVar2 = 0;
    if (uVar7 != 0) {
      for (; (uVar7 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    bVar1 = *(byte *)((ulong)uVar2 + (ulong)arch * 0xd8 + 0x14b0d4);
    if ((repeatCount < 2) || (EVar3 = String::_opFormat(sb,kAppend,".repeat %zu "), EVar3 == 0)) {
      String::_opChar(sb,kAppend,'.');
      String::_opString(sb,kAppend,&wordNameTable + (ulong)bVar1 * 8,0xffffffffffffffff);
      String::_opChar(sb,kAppend,' ');
      if (lVar5 != 0) {
        lVar4 = 0;
        do {
          if ((lVar4 != 0) && (EVar3 = String::_opString(sb,kAppend,", ",2), EVar3 != 0)) {
            return EVar3;
          }
          i = 0;
          switch(uVar7) {
          case 1:
            i = (uint64_t)(byte)*data;
            break;
          case 2:
            i = (uint64_t)(ushort)*data;
            break;
          case 4:
            i = (uint64_t)(uint)*data;
            break;
          case 8:
            i = *data;
          }
          EVar3 = String::_opNumber(sb,kAppend,i,0x10,(ulong)(uVar7 * 2),kAlternate);
          if (EVar3 != 0) {
            return EVar3;
          }
          data = (void *)((long)data + (ulong)uVar7);
          lVar4 = lVar4 + 1;
        } while (lVar5 != lVar4);
      }
      EVar3 = 0;
    }
  }
  return EVar3;
}

Assistant:

Error formatData(
  String& sb,
  FormatFlags formatFlags,
  Arch arch,
  TypeId typeId, const void* data, size_t itemCount, size_t repeatCount) noexcept
{
  DebugUtils::unused(formatFlags);

  if (ASMJIT_UNLIKELY(!Environment::isDefinedArch(arch)))
    return DebugUtils::errored(kErrorInvalidArch);

  uint32_t typeSize = TypeUtils::sizeOf(typeId);
  if (typeSize == 0)
    return DebugUtils::errored(kErrorInvalidState);

  if (!Support::isPowerOf2(typeSize)) {
    itemCount *= typeSize;
    typeSize = 1;
  }

  while (typeSize > 8u) {
    typeSize >>= 1;
    itemCount <<= 1;
  }

  uint32_t typeSizeLog2 = Support::ctz(typeSize);
  const char* wordName = wordNameTable[size_t(ArchTraits::byArch(arch).typeNameIdByIndex(typeSizeLog2))];

  if (repeatCount > 1)
    ASMJIT_PROPAGATE(sb.appendFormat(".repeat %zu ", repeatCount));

  return formatDataHelper(sb, wordName, typeSize, static_cast<const uint8_t*>(data), itemCount);
}